

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

BaseType __thiscall
diligent_spirv_cross::CompilerGLSL::get_builtin_basetype
          (CompilerGLSL *this,BuiltIn builtin,BaseType default_type)

{
  BaseType default_type_local;
  BuiltIn builtin_local;
  CompilerGLSL *this_local;
  
  if ((((builtin == BuiltInPrimitiveId) || (builtin - BuiltInLayer < 2)) ||
      (builtin == BuiltInSampleMask)) ||
     (((builtin == BuiltInPrimitiveShadingRateKHR || (builtin == BuiltInShadingRateKHR)) ||
      (this_local._4_4_ = default_type, builtin == BuiltInFragStencilRefEXT)))) {
    this_local._4_4_ = Int;
  }
  return this_local._4_4_;
}

Assistant:

SPIRType::BaseType CompilerGLSL::get_builtin_basetype(BuiltIn builtin, SPIRType::BaseType default_type)
{
	// TODO: Fill in for more builtins.
	switch (builtin)
	{
	case BuiltInLayer:
	case BuiltInPrimitiveId:
	case BuiltInViewportIndex:
	case BuiltInFragStencilRefEXT:
	case BuiltInSampleMask:
	case BuiltInPrimitiveShadingRateKHR:
	case BuiltInShadingRateKHR:
		return SPIRType::Int;

	default:
		return default_type;
	}
}